

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int run_run_container_xor(run_container_t *src_1,run_container_t *src_2,container_t **dst)

{
  undefined8 in_RAX;
  run_container_t *dst_00;
  container_t *pcVar1;
  uint8_t typecode_after;
  byte local_21;
  
  local_21 = (byte)((ulong)in_RAX >> 0x38);
  dst_00 = run_container_create();
  run_container_xor(src_1,src_2,dst_00);
  pcVar1 = convert_run_to_efficient_container_and_free(dst_00,&local_21);
  *dst = pcVar1;
  return (int)local_21;
}

Assistant:

int run_run_container_xor(const run_container_t *src_1,
                          const run_container_t *src_2, container_t **dst) {
    run_container_t *ans = run_container_create();
    run_container_xor(src_1, src_2, ans);
    uint8_t typecode_after;
    *dst = convert_run_to_efficient_container_and_free(ans, &typecode_after);
    return typecode_after;
}